

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O3

void sha512_done(sha512_ctx *ctx,sha512 *res)

{
  ulong uVar1;
  size_t sVar2;
  long lVar3;
  uint64_t sizedesc [2];
  undefined8 local_28;
  ulong uStack_20;
  
  local_28 = 0;
  sVar2 = ctx->bytes;
  uVar1 = sVar2 * 8;
  uStack_20 = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18
              | (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18
              | (uVar1 & 0xff00) << 0x28 | sVar2 << 0x3b;
  add(ctx,sha512_done::pad,(ulong)(0x6fU - (int)sVar2 & 0x7f) + 1);
  add(ctx,&local_28,0x10);
  lVar3 = 0;
  do {
    uVar1 = ctx->s[lVar3];
    (res->u).u64[lVar3] =
         uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
         (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
         (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  ctx->bytes = 0xffffffffffffffff;
  return;
}

Assistant:

void sha512_done(struct sha512_ctx *ctx, struct sha512 *res)
{
	static const unsigned char pad[128] = { 0x80 };
	uint64_t sizedesc[2] = { 0, 0 };
	size_t i;

	sizedesc[1] = cpu_to_be64((uint64_t)ctx->bytes << 3);

	/* Add '1' bit to terminate, then all 0 bits, up to next block - 16. */
	add(ctx, pad, 1 + ((256 - 16 - (ctx->bytes % 128) - 1) % 128));
	/* Add number of bits of data (big endian) */
	add(ctx, sizedesc, sizeof(sizedesc));
	for (i = 0; i < sizeof(ctx->s) / sizeof(ctx->s[0]); i++)
		res->u.u64[i] = cpu_to_be64(ctx->s[i]);
	invalidate_sha512(ctx);
}